

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::ScalarFunctionExtractor::ResultType
                  (Value *__return_storage_ptr__,ScalarFunctionCatalogEntry *entry,idx_t offset)

{
  ScalarFunction SStack_138;
  
  FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
            (&SStack_138,&(entry->functions).super_FunctionSet<duckdb::ScalarFunction>,offset);
  FunctionStabilityToValue(__return_storage_ptr__,SStack_138.super_BaseScalarFunction.stability);
  ScalarFunction::~ScalarFunction(&SStack_138);
  return __return_storage_ptr__;
}

Assistant:

static Value ResultType(ScalarFunctionCatalogEntry &entry, idx_t offset) {
		return FunctionStabilityToValue(entry.functions.GetFunctionByOffset(offset).stability);
	}